

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

ON_XMLNode * __thiscall ON_XMLNode::operator=(ON_XMLNode *this,ON_XMLNode *src)

{
  ON_XMLNode *src_00;
  ON_XMLProperty *prop;
  ON_XMLNode *this_00;
  recursive_mutex *__mutex;
  recursive_mutex *__mutex_00;
  ChildIterator ci;
  PropertyIterator pi;
  
  if (this != src) {
    __mutex = &this->_private->m_mutex;
    std::recursive_mutex::lock(__mutex);
    __mutex_00 = &src->_private->m_mutex;
    std::recursive_mutex::lock(__mutex_00);
    ON_XMLNodePrivate::RemoveAllProperties(this->_private);
    ON_XMLNodePrivate::RemoveAllChildren(this->_private);
    ON_wString::operator=(&this->_private->m_name,&src->_private->m_name);
    (*src->_vptr_ON_XMLNode[0x2d])(&pi,src,0);
    while( true ) {
      prop = PropertyIterator::GetNextProperty(&pi);
      if (prop == (ON_XMLProperty *)0x0) break;
      ON_XMLNodePrivate::AddProperty(this->_private,prop,true);
    }
    (*src->_vptr_ON_XMLNode[0x2c])(&ci,src);
    while( true ) {
      src_00 = (ci._private)->_current;
      if (src_00 == (ON_XMLNode *)0x0) break;
      (ci._private)->_current = src_00->_private->m_next_sibling;
      this_00 = (ON_XMLNode *)operator_new(0xe8);
      ON_XMLNode(this_00,src_00);
      (*this->_vptr_ON_XMLNode[0xb])(this,this_00);
    }
    ChildIterator::~ChildIterator(&ci);
    PropertyIterator::~PropertyIterator(&pi);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return this;
}

Assistant:

const ON_XMLNode& ON_XMLNode::operator = (const ON_XMLNode& src)
{
  if (this == &src)
    return *this;

  std::lock_guard<std::recursive_mutex> lg1(_private->m_mutex);
  std::lock_guard<std::recursive_mutex> lg2(src._private->m_mutex);

  _private->RemoveAllProperties();
  _private->RemoveAllChildren();

  _private->m_name = src._private->m_name;

  // Copy in the properties.
  ON_XMLProperty* pProperty = nullptr;
  auto pi = src.GetPropertyIterator();
  while (nullptr != (pProperty = pi.GetNextProperty()))
  {
    _private->AddProperty(*pProperty, true);  //Add it to the end so that the order stays the same.
  }

  // Copy in the children.
  ON_XMLNode* pChild = nullptr;
  auto ci = src.GetChildIterator();
  while (nullptr != (pChild = ci.GetNextChild()))
  {
    AttachChildNode(new ON_XMLNode(*pChild));
  }

  return *this;
}